

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffTable(NodeDiffComputer *this,TableDecl *lhs,TableDecl *rhs)

{
  bool bVar1;
  bool bVar2;
  size_type_conflict sVar3;
  size_type_conflict sVar4;
  size_type_conflict sVar5;
  int32_t iVar6;
  int32_t iVar7;
  ArenaVector<SQCompilation::TableMember> *this_00;
  ArenaVector<SQCompilation::TableMember> *this_01;
  TableMember *this_02;
  TableMember *this_03;
  TableDecl *in_RDX;
  TableDecl *in_RSI;
  NodeDiffComputer *in_RDI;
  int32_t valueDiff;
  int32_t keyDiff;
  TableMember *r;
  TableMember *l;
  int32_t i;
  int32_t tableDiff;
  ArenaVector<SQCompilation::TableMember> *rightMembers;
  ArenaVector<SQCompilation::TableMember> *leftMembers;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  size_type_conflict local_38;
  int local_34;
  int32_t local_4;
  
  this_00 = TableDecl::members(in_RSI);
  this_01 = TableDecl::members(in_RDX);
  sVar3 = ArenaVector<SQCompilation::TableMember>::size(this_00);
  sVar4 = ArenaVector<SQCompilation::TableMember>::size(this_01);
  if (sVar3 == sVar4) {
    local_34 = 0;
    local_38 = 0;
    while (sVar4 = local_38, sVar5 = ArenaVector<SQCompilation::TableMember>::size(this_00),
          sVar4 < sVar5) {
      this_02 = ArenaVector<SQCompilation::TableMember>::operator[](this_00,local_38);
      this_03 = ArenaVector<SQCompilation::TableMember>::operator[](this_01,local_38);
      iVar6 = diffNodes((NodeDiffComputer *)CONCAT44(sVar3,in_stack_ffffffffffffffa8),(Node *)in_RDI
                        ,(Node *)CONCAT44(in_stack_ffffffffffffff9c,sVar4));
      if (in_RDI->limit < iVar6) {
        return iVar6;
      }
      iVar7 = diffNodes((NodeDiffComputer *)CONCAT44(sVar3,in_stack_ffffffffffffffa8),(Node *)in_RDI
                        ,(Node *)CONCAT44(in_stack_ffffffffffffff9c,sVar4));
      if (in_RDI->limit < iVar7) {
        return iVar7;
      }
      local_34 = iVar6 + iVar7 + local_34;
      bVar1 = TableMember::isStatic(this_02);
      bVar2 = TableMember::isStatic(this_03);
      if (bVar1 != bVar2) {
        local_34 = (in_RDI->DiffCosts).StaticMemberDiffCost + local_34;
      }
      local_38 = local_38 + 1;
    }
    local_4 = local_34;
  }
  else {
    sVar3 = ArenaVector<SQCompilation::TableMember>::size(this_00);
    sVar4 = ArenaVector<SQCompilation::TableMember>::size(this_01);
    local_4 = sizeDiff(in_RDI,sVar3,sVar4);
  }
  return local_4;
}

Assistant:

int32_t diffTable(const TableDecl *lhs, const TableDecl *rhs) {
    const auto &leftMembers = lhs->members();
    const auto &rightMembers = rhs->members();

    if (leftMembers.size() != rightMembers.size())
      return sizeDiff(leftMembers.size(), rightMembers.size());

    int32_t tableDiff = 0;

    for (int32_t i = 0; i < leftMembers.size(); ++i) {
      const auto &l = leftMembers[i];
      const auto &r = rightMembers[i];

      int32_t keyDiff = diffNodes(l.key, r.key);

      if (keyDiff > limit)
        return keyDiff;

      int32_t valueDiff = diffNodes(l.value, r.value);

      if (valueDiff > limit)
        return valueDiff;

      tableDiff += (keyDiff + valueDiff);

      if (l.isStatic() != r.isStatic())
        tableDiff += DiffCosts.StaticMemberDiffCost;
    }

    return tableDiff;
  }